

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O1

bool __thiscall ON_NurbsSurface::GetGrevilleAbcissae(ON_NurbsSurface *this,int dir,double *g)

{
  bool bVar1;
  
  bVar1 = dir != 0;
  bVar1 = ON_GetGrevilleAbcissae
                    (this->m_order[bVar1],this->m_cv_count[bVar1],this->m_knot[bVar1],false,g);
  return bVar1;
}

Assistant:

bool ON_NurbsSurface::GetGrevilleAbcissae(
         int dir,
         double* g
         ) const
{
  if (dir) 
    dir = 1;
  // The "false" for the 4th parameter is on purpose and should not be
  // replaced with this->IsPeriodic(dir).  The problem
  // being that when the 4th parameter is true, it is not possible
  // to determine which subset of the full list of Greville abcissae
  // was returned.
  return ON_GetGrevilleAbcissae( m_order[dir], m_cv_count[dir], m_knot[dir], false, g );
}